

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_value.cpp
# Opt level: O1

char * Json::duplicateAndPrefixStringValue(char *value,uint length)

{
  uint *puVar1;
  ulong __n;
  OStringStream oss;
  String SStack_1b8;
  String local_198 [11];
  
  if (0x7ffffffa < length) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_198);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_198,
               "in Json::Value::duplicateAndPrefixStringValue(): length too big for prefixing",0x4d)
    ;
    std::__cxx11::stringbuf::str();
    throwLogicError(&SStack_1b8);
  }
  __n = (ulong)length;
  puVar1 = (uint *)malloc(__n + 5);
  if (puVar1 != (uint *)0x0) {
    *puVar1 = length;
    memcpy(puVar1 + 1,value,__n);
    *(char *)((long)puVar1 + __n + 4) = '\0';
    return (char *)puVar1;
  }
  local_198[0]._M_dataplus._M_p = (pointer)&local_198[0].field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_198,
             "in Json::Value::duplicateAndPrefixStringValue(): Failed to allocate string value buffer"
             ,"");
  throwRuntimeError(local_198);
}

Assistant:

static inline char* duplicateAndPrefixStringValue(const char* value,
                                                  unsigned int length) {
  // Avoid an integer overflow in the call to malloc below by limiting length
  // to a sane value.
  JSON_ASSERT_MESSAGE(length <= static_cast<unsigned>(Value::maxInt) -
                                    sizeof(unsigned) - 1U,
                      "in Json::Value::duplicateAndPrefixStringValue(): "
                      "length too big for prefixing");
  size_t actualLength = sizeof(length) + length + 1;
  auto newString = static_cast<char*>(malloc(actualLength));
  if (newString == nullptr) {
    throwRuntimeError("in Json::Value::duplicateAndPrefixStringValue(): "
                      "Failed to allocate string value buffer");
  }
  *reinterpret_cast<unsigned*>(newString) = length;
  memcpy(newString + sizeof(unsigned), value, length);
  newString[actualLength - 1U] =
      0; // to avoid buffer over-run accidents by users later
  return newString;
}